

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hasher.cpp
# Opt level: O1

void __thiscall
SaltedOutpointHasher::SaltedOutpointHasher(SaltedOutpointHasher *this,bool deterministic)

{
  undefined7 in_register_00000031;
  uint64_t uVar1;
  long in_FS_OFFSET;
  FastRandomContext FStack_a8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,deterministic) == 0) {
    FastRandomContext::FastRandomContext(&FStack_a8,false);
    uVar1 = FastRandomContext::rand64(&FStack_a8);
  }
  else {
    uVar1 = 0x8e819f2607a18de6;
  }
  if (deterministic) {
    this->k0 = uVar1;
    uVar1 = 0xf4020d2e3983b0eb;
  }
  else {
    ChaCha20::~ChaCha20(&FStack_a8.rng);
    this->k0 = uVar1;
    FastRandomContext::FastRandomContext(&FStack_a8,false);
    uVar1 = FastRandomContext::rand64(&FStack_a8);
    ChaCha20::~ChaCha20(&FStack_a8.rng);
  }
  this->k1 = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SaltedOutpointHasher::SaltedOutpointHasher(bool deterministic) :
    k0{deterministic ? 0x8e819f2607a18de6 : FastRandomContext().rand64()},
    k1{deterministic ? 0xf4020d2e3983b0eb : FastRandomContext().rand64()}
{}